

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  char *pcVar1;
  void *pvVar2;
  char *in_RCX;
  void *pvVar3;
  void *extraout_RDX_00;
  void *pvVar4;
  void *extraout_RDX_01;
  char *pcVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  StringRef Str;
  StringRef Str_00;
  void *extraout_RDX;
  
  pvVar3 = (void *)LineContents.Length;
  pcVar5 = LineContents.Data;
  pvVar4 = pvVar3;
  if ((uint)LineContents.Length != 0) {
    pvVar7 = (void *)0x0;
    uVar9 = 0;
    do {
      iVar6 = (int)pvVar7;
      if ((pvVar3 < pvVar7 || (long)pvVar3 - (long)pvVar7 == 0) ||
         (pvVar2 = memchr(pcVar5 + (long)pvVar7,9,(long)pvVar3 - (long)pvVar7),
         pvVar2 == (void *)0x0)) {
        pvVar2 = (void *)0xffffffffffffffff;
      }
      else {
        pvVar2 = (void *)((long)pvVar2 - (long)pcVar5);
      }
      if (pvVar2 == (void *)0xffffffffffffffff) {
        if (pvVar3 < pvVar7) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        Str_00.Length = (long)pvVar3 - (long)pvVar7;
        Str_00.Data = (char *)((long)pvVar7 + (long)pcVar5);
        llvm::raw_ostream::operator<<(S,Str_00);
        pvVar4 = extraout_RDX_01;
      }
      else {
        if (pvVar3 < pvVar7) {
          pvVar7 = pvVar3;
        }
        pvVar4 = pvVar2;
        if (pvVar2 < pvVar7) {
          pvVar4 = pvVar7;
        }
        if (pvVar3 < pvVar2) {
          pvVar4 = pvVar3;
        }
        Str.Length = (long)pvVar4 - (long)pvVar7;
        Str.Data = pcVar5 + (long)pvVar7;
        llvm::raw_ostream::operator<<(S,Str);
        iVar8 = uVar9 - iVar6;
        iVar6 = (int)pvVar2;
        uVar9 = iVar8 + iVar6;
        pvVar4 = extraout_RDX;
        do {
          pcVar1 = S->OutBufCur;
          if (pcVar1 < S->OutBufEnd) {
            in_RCX = pcVar1 + 1;
            S->OutBufCur = in_RCX;
            *pcVar1 = ' ';
          }
          else {
            llvm::raw_ostream::write(S,0x20,pvVar4,(size_t)in_RCX);
            pvVar4 = extraout_RDX_00;
          }
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 7) != 0);
      }
    } while ((pvVar2 != (void *)0xffffffffffffffff) &&
            (pvVar7 = (void *)(ulong)(iVar6 + 1U), iVar6 + 1U != (uint)LineContents.Length));
  }
  pcVar5 = S->OutBufCur;
  if (S->OutBufEnd <= pcVar5) {
    llvm::raw_ostream::write(S,10,pvVar4,(size_t)in_RCX);
    return;
  }
  S->OutBufCur = pcVar5 + 1;
  *pcVar5 = '\n';
  return;
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    size_t NextTab = LineContents.find('\t', i);
    // If there were no tabs left, print the rest, we are done.
    if (NextTab == StringRef::npos) {
      S << LineContents.drop_front(i);
      break;
    }

    // Otherwise, print from i to NextTab.
    S << LineContents.slice(i, NextTab);
    OutCol += NextTab - i;
    i = NextTab;

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}